

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O3

void __thiscall Gluco::Solver::analyzeFinal(Solver *this,Lit p,vec<Gluco::Lit> *out_conflict)

{
  ulong *puVar1;
  uint uVar2;
  VarData *pVVar3;
  uint *puVar4;
  int iVar5;
  undefined8 in_RAX;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  undefined8 local_38;
  
  local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),p.x);
  if (out_conflict->data != (Lit *)0x0) {
    out_conflict->sz = 0;
  }
  vec<Gluco::Lit>::push(out_conflict,(Lit *)&local_38);
  if ((this->trail_lim).sz != 0) {
    (this->seen).data[local_38._0_4_ >> 1] = '\x01';
    iVar9 = (this->trail).sz;
    lVar10 = (long)iVar9;
    iVar5 = *(this->trail_lim).data;
    if (iVar5 < iVar9) {
      do {
        iVar9 = (this->trail).data[lVar10 + -1].x;
        iVar7 = iVar9 >> 1;
        if ((this->seen).data[iVar7] != '\0') {
          pVVar3 = (this->vardata).data;
          uVar2 = pVVar3[iVar7].reason;
          uVar8 = (ulong)uVar2;
          if (uVar8 == 0xffffffff) {
            if (pVVar3[iVar7].level < 1) {
              __assert_fail("level(x) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                            ,0x2fb,"void Gluco::Solver::analyzeFinal(Lit, vec<Lit> &)");
            }
            local_38 = CONCAT44(iVar9,local_38._0_4_) ^ 0x100000000;
            vec<Gluco::Lit>::push(out_conflict,(Lit *)((long)&local_38 + 4));
          }
          else {
            if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= uVar2) {
              __assert_fail("r >= 0 && r < sz",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Alloc.h"
                            ,0x42,
                            "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            uVar6 = *(ulong *)(puVar4 + uVar8);
            if ((int)(uint)((uVar6 & 0xffffffff00000000) != 0x200000000) < (int)(uVar6 >> 0x20)) {
              puVar1 = (ulong *)(puVar4 + uVar8);
              uVar8 = (ulong)((uVar6 & 0xffffffff00000000) != 0x200000000);
              do {
                iVar9 = *(int *)((long)puVar1 + uVar8 * 4 + 0xc) >> 1;
                if (0 < (this->vardata).data[iVar9].level) {
                  (this->seen).data[iVar9] = '\x01';
                  uVar6 = *puVar1;
                }
                uVar8 = uVar8 + 1;
              } while ((long)uVar8 < (long)uVar6 >> 0x20);
            }
          }
          (this->seen).data[iVar7] = '\0';
          iVar5 = *(this->trail_lim).data;
        }
        lVar10 = lVar10 + -1;
      } while (iVar5 < lVar10);
    }
    (this->seen).data[local_38._0_4_ >> 1] = '\0';
  }
  return;
}

Assistant:

void Solver::analyzeFinal(Lit p, vec<Lit>& out_conflict)
{
    out_conflict.clear();
    out_conflict.push(p);

    if (decisionLevel() == 0)
        return;

    seen[var(p)] = 1;

    for (int i = trail.size()-1; i >= trail_lim[0]; i--){
        Var x = var(trail[i]);
        if (seen[x]){
            if (reason(x) == CRef_Undef){
                assert(level(x) > 0);
                out_conflict.push(~trail[i]);
            }else{
                Clause& c = ca[reason(x)];
                //                for (int j = 1; j < c.size(); j++) Minisat (glucose 2.0) loop 
                // Bug in case of assumptions due to special data structures for Binary.
                // Many thanks to Sam Bayless (sbayless@cs.ubc.ca) for discover this bug.
                for (int j = ((c.size()==2) ? 0:1); j < c.size(); j++)
                    if (level(var(c[j])) > 0)
                        seen[var(c[j])] = 1;
            }  

            seen[x] = 0;
        }
    }

    seen[var(p)] = 0;
}